

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::lookAt(Matrix4f *__return_storage_ptr__,Vector3f *eye,Vector3f *center,Vector3f *up)

{
  float fVar1;
  Vector4f local_98;
  Vector4f local_88;
  Vector4f local_78;
  Vector4f local_68;
  undefined1 local_58 [8];
  Vector3f x;
  Vector3f y;
  undefined1 local_34 [8];
  Vector3f z;
  Vector3f *up_local;
  Vector3f *center_local;
  Vector3f *eye_local;
  Matrix4f *view;
  
  z.m_elements._4_8_ = up;
  ::operator-((Vector3f *)(y.m_elements + 1),eye);
  Vector3f::normalized((Vector3f *)local_34);
  Vector3f::Vector3f((Vector3f *)(x.m_elements + 1),(Vector3f *)z.m_elements._4_8_);
  Vector3f::cross((Vector3f *)local_58,(Vector3f *)(x.m_elements + 1),(Vector3f *)local_34);
  Matrix4f(__return_storage_ptr__,0.0);
  fVar1 = Vector3f::dot((Vector3f *)local_58,eye);
  Vector4f::Vector4f(&local_68,(Vector3f *)local_58,-fVar1);
  setRow(__return_storage_ptr__,0,&local_68);
  fVar1 = Vector3f::dot((Vector3f *)(x.m_elements + 1),eye);
  Vector4f::Vector4f(&local_78,(Vector3f *)(x.m_elements + 1),-fVar1);
  setRow(__return_storage_ptr__,1,&local_78);
  fVar1 = Vector3f::dot((Vector3f *)local_34,eye);
  Vector4f::Vector4f(&local_88,(Vector3f *)local_34,-fVar1);
  setRow(__return_storage_ptr__,2,&local_88);
  Vector4f::Vector4f(&local_98,0.0,0.0,0.0,1.0);
  setRow(__return_storage_ptr__,3,&local_98);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::lookAt( const Vector3f& eye, const Vector3f& center, const Vector3f& up )
{
	// z is negative forward
	Vector3f z = ( eye - center ).normalized();
	Vector3f y = up;
	Vector3f x = Vector3f::cross( y, z );

	// the x, y, and z vectors define the orthonormal coordinate system
	// the affine part defines the overall translation
	Matrix4f view;

	view.setRow( 0, Vector4f( x, -Vector3f::dot( x, eye ) ) );
	view.setRow( 1, Vector4f( y, -Vector3f::dot( y, eye ) ) );
	view.setRow( 2, Vector4f( z, -Vector3f::dot( z, eye ) ) );
	view.setRow( 3, Vector4f( 0, 0, 0, 1 ) );

	return view;
}